

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemTaskTests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_47346::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody
          (BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test *this)

{
  bool bVar1;
  Child CVar2;
  bool bVar3;
  int iVar4;
  Child CVar5;
  char *pcVar6;
  size_t sVar7;
  undefined8 *puVar8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long lVar11;
  Child CVar12;
  pointer *__ptr;
  long *plVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *in_R9;
  pointer pcVar15;
  bool bVar16;
  StringRef namePrefix;
  StringRef Filename;
  StringRef Str;
  StringRef path;
  StringRef mainFilename;
  StringRef Filename_00;
  StringRef Str_00;
  StringRef path_00;
  StringRef mainFilename_00;
  StringRef str;
  AssertionResult gtest_ar__1;
  BuildSystem system;
  AssertionResult gtest_ar_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  messages;
  AssertionResult gtest_ar_;
  string linkFileList;
  Optional<llbuild::buildsystem::BuildValue> result;
  BuildKey keyToBuild;
  MockBuildSystemDelegate delegate;
  SmallString<256U> builddb;
  SmallString<256U> manifest;
  TmpDir tempDir;
  undefined1 local_5b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_5b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a8;
  BuildSystem local_590;
  AssertHelper local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_580;
  Child local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_570;
  Child local_560;
  Child local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540;
  undefined1 local_530 [16];
  long *local_520 [2];
  long local_510 [2];
  Child local_500;
  Child local_4f8;
  size_t local_4f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4e8;
  Child local_4d8;
  Child local_4d0;
  anon_union_80_2_ecfed234_for_valueData local_4c8;
  char local_468;
  Child local_460;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_458;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_450;
  BuildKey local_448;
  Child local_428;
  Child local_420;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_418 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3f8 [2];
  ExecutionQueueDelegate local_3b8 [2];
  AssertHelper local_3a8;
  long *local_3a0 [2];
  long local_390 [2];
  long *local_380 [2];
  long local_370 [2];
  Child local_360;
  long local_358;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [16];
  SmallVectorImpl<char> local_250;
  undefined1 local_240 [256];
  TmpDir local_140;
  
  namePrefix.Length = 8;
  namePrefix.Data = "TestBody";
  llbuild::TmpDir::TmpDir(&local_140,namePrefix);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_360,&local_140);
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_240;
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_250.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            (&local_250,local_360.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_360.twine)->LHS)->_M_local_buf + local_358);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    operator_delete(local_360.twine,local_350[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_360,"manifest.llbuild");
  llvm::Twine::Twine((Twine *)&local_428,"");
  llvm::Twine::Twine((Twine *)&local_4d8,"");
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::sys::path::append
            (&local_250,(Twine *)&local_360,(Twine *)&local_428,(Twine *)&local_4d8,
             (Twine *)&local_560);
  local_428.twine = (Twine *)((ulong)(uint)local_428._4_4_ << 0x20);
  CVar5.twine = (Twine *)std::_V2::system_category();
  Filename.Length._0_4_ =
       local_250.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  Filename.Data =
       (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  Filename.Length._4_4_ = 0;
  local_420.twine = CVar5.twine;
  llvm::raw_fd_ostream::raw_fd_ostream
            ((raw_fd_ostream *)&local_360,Filename,(error_code *)&local_428,F_Text);
  if (local_428.decUI != 0) {
    __assert_fail("!ec",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                  ,0x388,
                  "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                 );
  }
  Str.Length = 0xf12;
  Str.Data = 
  "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Hea..." /* TRUNCATED STRING LITERAL */
  ;
  llvm::raw_ostream::operator<<((raw_ostream *)&local_360,Str);
  llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_360);
  str.Length = 3;
  str.Data = "C.1";
  llbuild::buildsystem::BuildKey::BuildKey(&local_448,'C',str);
  llbuild::TmpDir::str_abi_cxx11_((string *)&local_428,&local_140);
  local_360.twine = (Twine *)local_350;
  local_358 = 0x10000000000;
  llvm::SmallVectorImpl<char>::append<char_const*,void>
            ((SmallVectorImpl<char> *)&local_360,local_428.cString,
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&(local_420.twine)->LHS)->_M_local_buf + local_428.cString);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428.twine != local_418) {
    operator_delete(local_428.twine,local_418[0]._M_allocated_capacity + 1);
  }
  llvm::Twine::Twine((Twine *)&local_428,"build.db");
  pcVar15 = "";
  llvm::Twine::Twine((Twine *)&local_4d8,"");
  llvm::Twine::Twine((Twine *)&local_560,"");
  llvm::Twine::Twine((Twine *)&local_4f8,"");
  llvm::sys::path::append
            ((SmallVectorImpl<char> *)&local_360,(Twine *)&local_428,(Twine *)&local_4d8,
             (Twine *)&local_560,(Twine *)&local_4f8);
  local_4f8.twine = (Twine *)&local_4e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4f8,
             "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList"
             ,"");
  llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
            ((MockBuildSystemDelegate *)&local_428,true);
  llbuild::basic::createLocalFileSystem();
  llbuild::buildsystem::BuildSystem::BuildSystem
            (&local_590,(BuildSystemDelegate *)&local_428,
             (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
              *)&local_450);
  if (local_450._M_head_impl != (FileSystem *)0x0) {
    (*(local_450._M_head_impl)->_vptr_FileSystem[1])();
  }
  local_450._M_head_impl = (FileSystem *)0x0;
  pcVar6 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
  if (pcVar6 == (char *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = strlen(pcVar6);
  }
  path.Length = sVar7;
  path.Data = pcVar6;
  llbuild::buildsystem::BuildSystem::attachDB(&local_590,path,(string *)0x0);
  mainFilename.Length._0_4_ =
       local_250.super_SmallVectorTemplateBase<char,_true>.
       super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  mainFilename.Data =
       (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  mainFilename.Length._4_4_ = 0;
  bVar3 = llbuild::buildsystem::BuildSystem::loadDescription(&local_590,mainFilename);
  local_560.character = bVar3;
  local_558.twine = (Twine *)0x0;
  if (bVar3) {
    local_500.twine = CVar5.twine;
    local_380[0] = local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_380,local_448.key.key._M_dataplus._M_p,
               local_448.key.key._M_dataplus._M_p + local_448.key.key._M_string_length);
    llbuild::buildsystem::BuildSystem::build
              ((Optional<llbuild::buildsystem::BuildValue> *)&local_4d8,&local_590,
               (BuildKey *)local_380);
    if (local_380[0] != local_370) {
      operator_delete(local_380[0],local_370[0] + 1);
    }
    local_5b8[0] = (internal)local_468;
    pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_468 != '\0') {
      if (local_468 == '\0') {
LAB_001334d1:
        __assert_fail("Storage.hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/Optional.h"
                      ,0xb0,
                      "T *llvm::Optional<llbuild::buildsystem::BuildValue>::getPointer() [T = llbuild::buildsystem::BuildValue]"
                     );
      }
      local_5b8[0] = (internal)(local_4d8.decUI == 7);
      pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_4d8.decUI != 7) {
        testing::Message::Message((Message *)&local_578);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_560,(internal *)local_5b8,
                   (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",in_R9)
        ;
        iVar4 = 0x3a9;
        goto LAB_0013290b;
      }
      if (local_468 == '\0') goto LAB_001334d1;
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_560,
                 (BuildValue *)&local_4d8);
      local_578.twine = (Twine *)((long)local_558.twine - (long)local_560 >> 4);
      local_588.data_ = (AssertHelperData *)0x32;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)local_5b8,"result.getValue().getStaleFileList().size()","50UL",
                 (unsigned_long *)&local_578.decUI,(unsigned_long *)&local_588);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560.twine !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_560.twine,local_550._M_allocated_capacity - (long)local_560);
      }
      if (local_5b8[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_560);
        if (pbStack_5b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar15 = (pbStack_5b0->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3aa,pcVar15);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)&local_560)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
        CVar5 = local_560;
        goto LAB_00132942;
      }
      if (pbStack_5b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_5b0,pbStack_5b0);
      }
      if (local_468 == '\0') goto LAB_001334d1;
      llbuild::buildsystem::BuildValue::getStaleFileList
                ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_560,
                 (BuildValue *)&local_4d8);
      sVar7 = local_4f0;
      CVar2 = local_4f8;
      CVar5 = local_558;
      local_460.twine = local_560.twine;
      if (local_560.twine == local_558.twine) {
        bVar3 = false;
      }
      else {
        CVar12 = local_560;
        bVar1 = false;
        do {
          bVar16 = (CVar12.stdString)->_M_string_length != sVar7;
          bVar3 = true;
          if (bVar16) {
            bVar3 = bVar1;
          }
          if ((!bVar16 && sVar7 != 0) &&
             (iVar4 = bcmp((void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)&(CVar12.smallString)->
                                        super_SmallVectorTemplateBase<char,_true>)->
                                   _M_allocated_capacity,CVar2.twine,sVar7), bVar3 = bVar1,
             iVar4 == 0)) {
            bVar3 = true;
          }
          CVar12.twine = (Twine *)&(CVar12.twine)->LHSKind;
          bVar1 = bVar3;
        } while (CVar12.twine != CVar5.twine);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460.twine !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_460.twine,local_550._M_allocated_capacity - (long)local_460);
      }
      local_5b8[0] = (internal)bVar3;
      pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (!bVar3) {
        testing::Message::Message((Message *)&local_578);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_560,(internal *)local_5b8,(AssertionResult *)"hasLinkFileList",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_588,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3b3,local_560.cString);
        testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_578);
        testing::internal::AssertHelper::~AssertHelper(&local_588);
        CVar5 = local_578;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560.twine == &local_550) goto LAB_00132942;
        goto LAB_00132930;
      }
      local_560.twine = (Twine *)&local_550;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_560,"commandPreparing(C.1)","");
      local_540._M_allocated_capacity = (size_type)local_530;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_540,"commandStarted(C.1)","")
      ;
      plVar13 = local_510;
      local_520[0] = plVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_520,"commandFinished(C.1: 0)","");
      local_5b8 = (undefined1  [8])0x0;
      pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_5a8._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_5b8,
                 &local_560,&local_500);
      llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_578,(MockBuildSystemDelegate *)&local_428);
      testing::internal::
      CmpHelperEQ<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                ((internal *)&local_588,
                 "std::vector<std::string>({ \"commandPreparing(C.1)\", \"commandStarted(C.1)\", \"commandFinished(C.1: 0)\", })"
                 ,"delegate.getMessages()",
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5b8,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_578);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_578);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_5b8);
      lVar11 = -0x60;
      do {
        if (plVar13 != (long *)plVar13[-2]) {
          operator_delete((long *)plVar13[-2],*plVar13 + 1);
        }
        plVar13 = plVar13 + -4;
        lVar11 = lVar11 + 0x20;
      } while (lVar11 != 0);
      if (local_588.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_560);
        if (local_580 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = "";
        }
        else {
          pcVar15 = (local_580->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_5b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3b9,pcVar15);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_5b8,(Message *)&local_560);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_5b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560.twine !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*local_560.decUL + 8))();
        }
        if (local_580 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_580;
          pbVar14 = local_580;
LAB_001331bf:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,pbVar14);
        }
LAB_001331c4:
        if (local_468 == '\x01') {
          llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
          local_468 = '\0';
        }
      }
      else {
        if (local_580 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_580,local_580);
        }
        CVar5 = local_500;
        if (local_468 == '\x01') {
          llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
          local_468 = '\0';
        }
        llbuild::buildsystem::BuildSystem::~BuildSystem(&local_590);
        llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                  ((MockBuildSystemDelegate *)&local_428);
        local_4d8.decUI = 0;
        local_4d0 = CVar5;
        Filename_00.Length._0_4_ =
             local_250.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        Filename_00.Data =
             (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        Filename_00.Length._4_4_ = 0;
        llvm::raw_fd_ostream::raw_fd_ostream
                  ((raw_fd_ostream *)&local_428,Filename_00,(error_code *)&local_4d8,F_Text);
        if (local_4d8.decUI != 0) {
          __assert_fail("!ec",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                        ,0x3bf,
                        "virtual void (anonymous namespace)::BuildSystemTaskTests_staleFileRemovalWithManyFiles_Test::TestBody()"
                       );
        }
        Str_00.Length = 0xc1d;
        Str_00.Data = 
        "\nclient:\n  name: mock\n\ncommands:\n    C.1:\n      tool: stale-file-removal\n      expectedOutputs: [\"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap\", \"/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-targe..." /* TRUNCATED STRING LITERAL */
        ;
        llvm::raw_ostream::operator<<((raw_ostream *)&local_428,Str_00);
        llvm::raw_fd_ostream::~raw_fd_ostream((raw_fd_ostream *)&local_428);
        llbuild::unittests::MockBuildSystemDelegate::MockBuildSystemDelegate
                  ((MockBuildSystemDelegate *)&local_428,true);
        llbuild::basic::createLocalFileSystem();
        llbuild::buildsystem::BuildSystem::BuildSystem
                  (&local_590,(BuildSystemDelegate *)&local_428,
                   (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                    *)&local_458);
        if (local_458._M_head_impl != (FileSystem *)0x0) {
          (*(local_458._M_head_impl)->_vptr_FileSystem[1])();
        }
        local_458._M_head_impl = (FileSystem *)0x0;
        pcVar6 = llvm::SmallString<256U>::c_str((SmallString<256U> *)&local_360);
        if (pcVar6 == (char *)0x0) {
          sVar7 = 0;
        }
        else {
          sVar7 = strlen(pcVar6);
        }
        path_00.Length = sVar7;
        path_00.Data = pcVar6;
        llbuild::buildsystem::BuildSystem::attachDB(&local_590,path_00,(string *)0x0);
        mainFilename_00.Length._0_4_ =
             local_250.super_SmallVectorTemplateBase<char,_true>.
             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
        mainFilename_00.Data =
             (char *)local_250.super_SmallVectorTemplateBase<char,_true>.
                     super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
        mainFilename_00.Length._4_4_ = 0;
        bVar3 = llbuild::buildsystem::BuildSystem::loadDescription(&local_590,mainFilename_00);
        local_560.character = bVar3;
        local_558.twine = (Twine *)0x0;
        if (bVar3) {
          local_3a0[0] = local_390;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_3a0,local_448.key.key._M_dataplus._M_p,
                     local_448.key.key._M_dataplus._M_p + local_448.key.key._M_string_length);
          llbuild::buildsystem::BuildSystem::build
                    ((Optional<llbuild::buildsystem::BuildValue> *)&local_4d8,&local_590,
                     (BuildKey *)local_3a0);
          if (local_3a0[0] != local_390) {
            operator_delete(local_3a0[0],local_390[0] + 1);
          }
          local_5b8[0] = (internal)local_468;
          pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          if (local_468 == '\0') {
            testing::Message::Message((Message *)&local_578);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&local_560,(internal *)local_5b8,
                       (AssertionResult *)"result.hasValue()","false","true",in_R9);
            iVar4 = 0x3d4;
LAB_00133173:
            testing::internal::AssertHelper::AssertHelper
                      (&local_588,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,iVar4,local_560.cString);
            testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_578);
            testing::internal::AssertHelper::~AssertHelper(&local_588);
            CVar5 = local_578;
            if (local_560.twine != (Twine *)&local_550) {
LAB_00133193:
              operator_delete(local_560.twine,local_550._M_allocated_capacity + 1);
              CVar5 = local_578;
            }
          }
          else {
            if (local_468 == '\0') goto LAB_001334d1;
            local_5b8[0] = (internal)(local_4d8.decUI == 7);
            pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_4d8.decUI != 7) {
              testing::Message::Message((Message *)&local_578);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_560,(internal *)local_5b8,
                         (AssertionResult *)"result.getValue().isStaleFileRemoval()","false","true",
                         in_R9);
              iVar4 = 0x3d5;
              goto LAB_00133173;
            }
            if (local_468 == '\0') goto LAB_001334d1;
            llbuild::buildsystem::BuildValue::getStaleFileList
                      ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_560,
                       (BuildValue *)&local_4d8);
            local_578.twine = (Twine *)((long)local_558.twine - (long)local_560 >> 4);
            local_588.data_ = (AssertHelperData *)0x16;
            testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                      ((internal *)local_5b8,"result.getValue().getStaleFileList().size()","22UL",
                       (unsigned_long *)&local_578.decUI,(unsigned_long *)&local_588);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_560.twine !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete(local_560.twine,local_550._M_allocated_capacity - (long)local_560);
            }
            if (local_5b8[0] != (internal)0x0) {
              if (pbStack_5b0 !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                std::
                default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&pbStack_5b0,pbStack_5b0);
              }
              if (local_468 == '\0') goto LAB_001334d1;
              llbuild::buildsystem::BuildValue::getStaleFileList
                        ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_560,
                         (BuildValue *)&local_4d8);
              CVar2 = local_4f8;
              CVar5 = local_558;
              local_500.twine = local_560.twine;
              if (local_560.twine == local_558.twine) {
                bVar3 = false;
              }
              else {
                CVar12 = local_560;
                bVar1 = false;
                do {
                  bVar16 = (CVar12.stdString)->_M_string_length != local_4f0;
                  bVar3 = true;
                  if (bVar16) {
                    bVar3 = bVar1;
                  }
                  if ((!bVar16 && local_4f0 != 0) &&
                     (iVar4 = bcmp((void *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)&(CVar12.smallString)->
                                                super_SmallVectorTemplateBase<char,_true>)->
                                           _M_allocated_capacity,CVar2.twine,local_4f0),
                     bVar3 = bVar1, iVar4 == 0)) {
                    bVar3 = true;
                  }
                  CVar12.twine = (Twine *)&(CVar12.twine)->LHSKind;
                  bVar1 = bVar3;
                } while (CVar12.twine != CVar5.twine);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_500.twine !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete(local_500.twine,local_550._M_allocated_capacity - (long)local_500);
              }
              local_5b8[0] = (internal)bVar3;
              pbStack_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
              ;
              if (bVar3) {
                llbuild::unittests::MockBuildSystemDelegate::getMessages_abi_cxx11_
                          ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_578,(MockBuildSystemDelegate *)&local_428);
                pbVar14 = local_570;
                CVar5 = local_578;
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_5b8,"cannot remove stale file \'",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_4f8);
                puVar8 = (undefined8 *)std::__cxx11::string::append(local_5b8);
                local_560.twine = (Twine *)&local_550;
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(puVar8 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar8 == paVar10) {
                  local_550._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_550._8_4_ = *(undefined4 *)(puVar8 + 3);
                  local_550._12_4_ = *(undefined4 *)((long)puVar8 + 0x1c);
                }
                else {
                  local_550._M_allocated_capacity = paVar10->_M_allocated_capacity;
                  local_560.decUL = ((unsigned_long *)*puVar8).decUL;
                }
                local_558 = *(Child *)(puVar8 + 1);
                *puVar8 = paVar10;
                puVar8[1] = 0;
                *(undefined1 *)(puVar8 + 2) = 0;
                _Var9 = std::
                        __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                  (CVar5.twine,pbVar14,&local_560);
                local_588.data_._0_1_ = (internal)(_Var9._M_current == local_570);
                local_580 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                ;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_560.twine != &local_550) {
                  operator_delete(local_560.twine,local_550._M_allocated_capacity + 1);
                }
                if (local_5b8 != (undefined1  [8])&local_5a8) {
                  operator_delete((void *)local_5b8,(ulong)(local_5a8._M_allocated_capacity + 1));
                }
                if (local_588.data_._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)local_5b8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            ((string *)&local_560,(internal *)&local_588,
                             (AssertionResult *)
                             "std::find(messages.begin(), messages.end(), \"cannot remove stale file \'\" + linkFileList + \"\': No such file or directory\") != messages.end()"
                             ,"true","false",in_R9);
                  testing::internal::AssertHelper::AssertHelper
                            (&local_3a8,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                             ,0x3e3,local_560.cString);
                  testing::internal::AssertHelper::operator=(&local_3a8,(Message *)local_5b8);
                  testing::internal::AssertHelper::~AssertHelper(&local_3a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_560.twine != &local_550) {
                    operator_delete(local_560.twine,local_550._M_allocated_capacity + 1);
                  }
                  if (local_5b8 != (undefined1  [8])0x0) {
                    (**(code **)(*(size_type *)local_5b8 + 8))();
                  }
                }
                if (local_580 !=
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
                  std::
                  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_580,local_580);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_578);
                goto LAB_001331c4;
              }
              testing::Message::Message((Message *)&local_578);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&local_560,(internal *)local_5b8,
                         (AssertionResult *)"hasLinkFileList","false","true",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_588,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                         ,0x3df,local_560.cString);
              testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_578);
              testing::internal::AssertHelper::~AssertHelper(&local_588);
              CVar5 = local_578;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_560.twine == &local_550) goto LAB_001331a5;
              goto LAB_00133193;
            }
            testing::Message::Message((Message *)&local_560);
            if (pbStack_5b0 ==
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pcVar15 = "";
            }
            else {
              pcVar15 = (pbStack_5b0->_M_dataplus)._M_p;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&local_578,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                       ,0x3d6,pcVar15);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&local_578,(Message *)&local_560);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
            CVar5 = local_560;
          }
LAB_001331a5:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CVar5.twine !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*CVar5.decUL + 8))();
          }
          if (pbStack_5b0 !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&pbStack_5b0;
            pbVar14 = pbStack_5b0;
            goto LAB_001331bf;
          }
          goto LAB_001331c4;
        }
        testing::Message::Message((Message *)local_5b8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&local_4d8,(internal *)&local_560.character,
                   (AssertionResult *)"loadingResult","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_578,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
                   ,0x3d1,(char *)CONCAT44(local_4d8._4_4_,local_4d8.decUI));
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_5b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
        if ((anon_union_80_2_ecfed234_for_valueData *)CONCAT44(local_4d8._4_4_,local_4d8.decUI) !=
            &local_4c8) {
          operator_delete((anon_union_80_2_ecfed234_for_valueData *)
                          CONCAT44(local_4d8._4_4_,local_4d8.decUI),
                          (ulong)(local_4c8.asOutputInfo.device + 1));
        }
        if (local_5b8 != (undefined1  [8])0x0) {
          (**(code **)(*(size_type *)local_5b8 + 8))();
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_558.twine !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_558.character,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_558.twine);
        }
      }
      llbuild::buildsystem::BuildSystem::~BuildSystem(&local_590);
      llbuild::unittests::MockBuildSystemDelegate::~MockBuildSystemDelegate
                ((MockBuildSystemDelegate *)&local_428);
      goto LAB_001329bb;
    }
    testing::Message::Message((Message *)&local_578);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_560,(internal *)local_5b8,(AssertionResult *)"result.hasValue()",
               "false","true",in_R9);
    iVar4 = 0x3a8;
LAB_0013290b:
    testing::internal::AssertHelper::AssertHelper
              (&local_588,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,iVar4,local_560.cString);
    testing::internal::AssertHelper::operator=(&local_588,(Message *)&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_588);
    CVar5 = local_578;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560.twine != &local_550) {
LAB_00132930:
      operator_delete(local_560.twine,local_550._M_allocated_capacity + 1);
      CVar5 = local_578;
    }
LAB_00132942:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CVar5.twine !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*CVar5.decUL + 8))();
    }
    if (pbStack_5b0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_5b0,pbStack_5b0);
    }
    if (local_468 == '\x01') {
      llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)&local_4d8);
      local_468 = '\0';
    }
  }
  else {
    testing::Message::Message((Message *)local_5b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&local_4d8,(internal *)&local_560.character,
               (AssertionResult *)"loadingResult","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_578,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/BuildSystem/BuildSystemTaskTests.cpp"
               ,0x3a4,(char *)CONCAT44(local_4d8._4_4_,local_4d8.decUI));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_578,(Message *)local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_578);
    if ((anon_union_80_2_ecfed234_for_valueData *)CONCAT44(local_4d8._4_4_,local_4d8.decUI) !=
        &local_4c8) {
      operator_delete((anon_union_80_2_ecfed234_for_valueData *)
                      CONCAT44(local_4d8._4_4_,local_4d8.decUI),
                      (ulong)(local_4c8.asOutputInfo.device + 1));
    }
    if (local_5b8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_5b8 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558.twine !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_558.character,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_558.twine);
    }
  }
  llbuild::buildsystem::BuildSystem::~BuildSystem(&local_590);
  local_428.twine = (Twine *)&PTR__MockBuildSystemDelegate_002554b0;
  llbuild::basic::ExecutionQueueDelegate::~ExecutionQueueDelegate(local_3b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_3f8);
  llbuild::buildsystem::BuildSystemDelegate::~BuildSystemDelegate((BuildSystemDelegate *)&local_428)
  ;
LAB_001329bb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8.twine != &local_4e8) {
    operator_delete(local_4f8.twine,local_4e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.twine != local_350) {
    free(local_360.twine);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448.key.key._M_dataplus._M_p != &local_448.key.key.field_2) {
    operator_delete(local_448.key.key._M_dataplus._M_p,
                    local_448.key.key.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      local_250.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_240) {
    free(local_250.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  llbuild::TmpDir::~TmpDir(&local_140);
  return;
}

Assistant:

TEST(BuildSystemTaskTests, staleFileRemovalWithManyFiles) {
  TmpDir tempDir(__func__);

  SmallString<256> manifest{ tempDir.str() };
  sys::path::append(manifest, "manifest.llbuild");
  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic-extra-header.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-extra-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Modules/module.modulemap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic, /var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Modules", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/module.modulemap"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  auto keyToBuild = BuildKey::makeCommand("C.1");

  SmallString<256> builddb{ tempDir.str() };
  sys::path::append(builddb, "build.db");

  // We will check that the same file is present in both file lists, so it should not show up in the difference.
  std::string linkFileList = "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList";

  {
    MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
    BuildSystem system(delegate, createLocalFileSystem());
    system.attachDB(builddb.c_str(), nullptr);

    bool loadingResult = system.loadDescription(manifest);
    ASSERT_TRUE(loadingResult);

    auto result = system.build(keyToBuild);

    ASSERT_TRUE(result.hasValue());
    ASSERT_TRUE(result.getValue().isStaleFileRemoval());
    ASSERT_EQ(result.getValue().getStaleFileList().size(), 50UL);

    // Check that `LinkFileList` is present in list of files of initial build
    bool hasLinkFileList = false;
    for (auto staleFile : result.getValue().getStaleFileList()) {
      if (staleFile == linkFileList) {
        hasLinkFileList = true;
      }
    }
    ASSERT_TRUE(hasLinkFileList);

    ASSERT_EQ(std::vector<std::string>({
      "commandPreparing(C.1)",
      "commandStarted(C.1)",
      "commandFinished(C.1: 0)",
    }), delegate.getMessages());
  }

  {
    std::error_code ec;
    llvm::raw_fd_ostream os(manifest, ec, llvm::sys::fs::F_Text);
    assert(!ec);

    os << R"END(
client:
  name: mock

commands:
    C.1:
      tool: stale-file-removal
      expectedOutputs: ["/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/empty.o", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers/CoreBasic.h", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/CoreBasic-resource.txt", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/A/Resources/Info.plist", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/CoreBasic", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Headers", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Resources", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products/Debug/CoreBasic.framework/Versions/Current", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-non-framework-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-all-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-generated-files.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-own-target-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic-project-headers.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/CoreBasic.hmap", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/Objects-normal/x86_64/CoreBasic.LinkFileList", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates/basic.build/Debug/CoreBasic.build/all-product-headers.yaml"]
      roots: ["/tmp/basic.dst", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Intermediates", "/var/folders/1f/r6txd12925s9kytl1_pckt_w0000gp/T/Tests/Build/Products"]
)END";
  }

  MockBuildSystemDelegate delegate(/*trackAllMessages=*/true);
  BuildSystem system(delegate, createLocalFileSystem());
  system.attachDB(builddb.c_str(), nullptr);
  bool loadingResult = system.loadDescription(manifest);
  ASSERT_TRUE(loadingResult);
  auto result = system.build(keyToBuild);

  ASSERT_TRUE(result.hasValue());
  ASSERT_TRUE(result.getValue().isStaleFileRemoval());
  ASSERT_EQ(result.getValue().getStaleFileList().size(), 22UL);

  // Check that `LinkFileList` is present in list of files of second build
  bool hasLinkFileList = false;
  for (auto staleFile : result.getValue().getStaleFileList()) {
    if (staleFile == linkFileList) {
      hasLinkFileList = true;
    }
  }
  ASSERT_TRUE(hasLinkFileList);

  // Check that `LinkFileList` is not present in the diff
  std::vector<std::string> messages = delegate.getMessages();
  ASSERT_FALSE(std::find(messages.begin(), messages.end(), "cannot remove stale file '" + linkFileList + "': No such file or directory") != messages.end());
}